

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ubjson_cursor.hpp
# Opt level: O2

void __thiscall
jsoncons::ubjson::basic_ubjson_cursor<jsoncons::bytes_source,std::allocator<char>>::
basic_ubjson_cursor<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
          (basic_ubjson_cursor<jsoncons::bytes_source,std::allocator<char>> *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *source,
          ubjson_decode_options *options,allocator<char> *alloc)

{
  char cVar1;
  
  *(undefined8 *)this = 0x9b4fb0;
  *(undefined8 *)(this + 0xf8) = 0x9b5050;
  basic_ubjson_parser<jsoncons::bytes_source,std::allocator<char>>::
  basic_ubjson_parser<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
            ((basic_ubjson_parser<jsoncons::bytes_source,std::allocator<char>> *)(this + 8),source,
             options,alloc);
  *(undefined ***)(this + 0x90) = &PTR__basic_json_visitor_00998270;
  *(undefined2 *)(this + 0x98) = 3;
  *(undefined4 *)(this + 0xc0) = 0;
  *(undefined8 *)(this + 0xa0) = 0;
  *(undefined8 *)(this + 0xa8) = 0;
  *(undefined8 *)(this + 0xac) = 0;
  *(undefined8 *)(this + 0xb4) = 0;
  *(undefined8 *)(this + 200) = 0;
  *(undefined8 *)(this + 0xd0) = 0;
  *(undefined8 *)(this + 0xd8) = 0;
  *(undefined8 *)(this + 0xe0) = 0;
  *(undefined8 *)(this + 0xe1) = 0;
  *(undefined8 *)(this + 0xe9) = 0;
  this[0x18] = (basic_ubjson_cursor<jsoncons::bytes_source,std::allocator<char>>)0x1;
  cVar1 = (**(code **)(*(long *)this + 0x18))(this);
  if (cVar1 == '\0') {
    (**(code **)(*(long *)this + 0x38))(this);
  }
  return;
}

Assistant:

basic_ubjson_cursor(Sourceable&& source,
        const ubjson_decode_options& options = ubjson_decode_options(),
        const Allocator& alloc = Allocator())
       : parser_(std::forward<Sourceable>(source), options, alloc)
    {
        parser_.cursor_mode(true);
        if (!done())
        {
            next();
        }
    }